

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

FileBufSlot * read_normal_file(FileReader data)

{
  FILE *__stream;
  size_t __n;
  int iVar1;
  FileBufSlot *pFVar2;
  size_t sVar3;
  RK_U32 local_44;
  RK_U32 eos;
  FileBufSlot *slot;
  size_t size;
  size_t buf_size;
  size_t read_size;
  FILE *fp;
  FileReaderImpl *impl;
  FileReader data_local;
  
  __stream = *data;
  __n = *(size_t *)((long)data + 0x20);
  pFVar2 = (FileBufSlot *)
           mpp_osal_malloc("read_normal_file",__n + 0x28 + *(long *)((long)data + 0x28));
  local_44 = 0;
  pFVar2->data = (char *)(pFVar2 + 1);
  sVar3 = fread(pFVar2->data,1,__n,__stream);
  *(size_t *)((long)data + 0x40) = sVar3 + *(long *)((long)data + 0x40);
  *(size_t *)((long)data + 0x48) = sVar3;
  if (sVar3 == __n) {
    iVar1 = feof(__stream);
    if ((iVar1 == 0) && (*(ulong *)((long)data + 0x40) < *(ulong *)((long)data + 8)))
    goto LAB_001090cd;
  }
  local_44 = 1;
LAB_001090cd:
  pFVar2->buf = (MppBuffer)0x0;
  pFVar2->size = sVar3;
  pFVar2->eos = local_44;
  return pFVar2;
}

Assistant:

static FileBufSlot *read_normal_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    FILE *fp = impl->fp_input;
    size_t read_size = 0;
    size_t buf_size = impl->buf_size;
    size_t size = sizeof(FileBufSlot) + buf_size + impl->stuff_size;
    FileBufSlot *slot = mpp_malloc_size(FileBufSlot, size);
    RK_U32 eos = 0;

    slot->data = (char *)(slot + 1);
    read_size = fread(slot->data, 1, buf_size, fp);
    impl->read_total += read_size;
    impl->read_size = read_size;

    /* check reach eos whether or not */
    if (read_size != buf_size || feof(fp) || impl->read_total >= impl->file_size)
        eos = 1;

    slot->buf = NULL;
    slot->size  = read_size;
    slot->eos   = eos;

    return slot;
}